

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_line.cc
# Opt level: O3

pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
* StringLine::convert_string
            (pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
             *__return_storage_ptr__,string *s)

{
  char *pcVar1;
  int lineNumber;
  vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> errors;
  vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> sls;
  int local_c0 [2];
  StringLine *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined1 local_a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> local_78;
  vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> local_58;
  pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  *local_38;
  
  local_58.
  super__Vector_base<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0[0] = 1;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_b8 = (StringLine *)0x0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<StringLine,std::allocator<StringLine>,int&,std::__cxx11::string>
            (&local_b0,&local_b8,(allocator<StringLine> *)local_a8,local_c0,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (pcVar1 != (s->_M_dataplus)._M_p + s->_M_string_length) {
    do {
      if (*pcVar1 != '/') {
        pcVar1 = pcVar1 + -1;
      }
      pcVar1 = pcVar1 + 1;
      local_38 = __return_storage_ptr__;
    } while (pcVar1 != (s->_M_dataplus)._M_p + s->_M_string_length);
  }
  std::
  pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  ::
  pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>_&,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_&,_true>
            (__return_storage_ptr__,&local_58,&local_78);
  if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_pi);
  }
  std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>::~vector(&local_78);
  std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::~vector
            (&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<std::shared_ptr<StringLine>>, std::vector<ErrorInfoException>>
StringLine::convert_string(const std::string *s) {
    std::vector<std::shared_ptr<StringLine>> sls;
    std::vector<ErrorInfoException> errors;
    int lineNumber = 1;
    auto it = s->begin();
    //StringLine
    auto sl = std::make_shared<StringLine>(lineNumber, std::string());
    int state = 0;
    //判断当前扫描的字符串是否在注释中
    bool isAnnotation = false;
    //判断注释是否在字符串中
    bool annotationInString = false;
    while (it != s->end()) {
        switch (state) {
            //初始读取状态，判断是注释还是普通字符
            case 0: {
                //注释如果在字符里面，就不进行跳转，当作普通字符处理
                if (*it == '/' && !annotationInString)state = 1;
                else {
                    state = 6;
                    --it;
                }
                break;
            }
                //判断第二个/，或者第一个*
            case 1: {
                if (*it == '/')state = 2;
                else if (*it == '*')state = 4;
                else {
                    state = 0;
                    --it;
                }
                break;
            }
                // 判断是//注释，还是换行停止
            case 2: {
                if (*it == '\n') {
                    state = 3;
                    --it;
                } else {
                    sl->get_text().push_back(' ');
                    state = 2;
                }
                break;
            }
                //处理已经读取了一行的情况
            case 3: {
                if (!sutil::trim(sl->get_text()).empty()) {
                    sl->get_text().push_back('\n');
                    sls.push_back(sl);
                }
                sl = std::make_shared<StringLine>(lineNumber, std::string());
                ++lineNumber;
                state = isAnnotation ? 4 : 0;
                break;
            }
                // 处理/*注释
            case 4: {
                if (*it == '*')state = 5;
                else {
                    isAnnotation = true;
                    if (*it == '\n') {
                        state = 3;
                        --it;
                    } else {
                        sl->get_text().push_back(' ');
                        state = 4;
                    }
                }
                break;
            }
                // 判断*后面是否是/
            case 5: {
                if (*it == '/') {
                    sl->get_text().append("    ");
                    isAnnotation = false;
                    state = 0;
                } else {
                    state = 4;
                    --it;
                }
                break;
            }
                //读取普通字符
            case 6: {
                if (*it == '"') annotationInString = !annotationInString;
                if (*it == '/' && !annotationInString) {
                    state = 0;
                    --it;
                } else if (*it != '\n') {
                    sl->set_line(lineNumber);
                    sl->get_text().push_back(*it);
                    state = 6;
                } else {
                    state = 3;
                    --it;
                }
            }
            default: {
            }
        }
        ++it;
    }
    if (isAnnotation) {
        errors.emplace_back(lineNumber, 0, 0,  "Brother, where is your annotation tail?");
    }
    return std::make_pair(sls, errors);
}